

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O1

MPP_RET mpp_packet_read(MppPacket packet,size_t offset,void *data,size_t size)

{
  long lVar1;
  MPP_RET MVar2;
  
  MVar2 = check_is_mpp_packet_f(packet,"mpp_packet_read");
  if ((data == (void *)0x0) || (MVar2 != MPP_OK)) {
    _mpp_log_l(2,"mpp_packet","invalid input: packet %p data %p\n","mpp_packet_read",packet,data);
    MVar2 = MPP_ERR_UNKNOW;
  }
  else {
    MVar2 = MPP_OK;
    if (size != 0) {
      check_is_mpp_packet_f(packet,"mpp_packet_get_data");
      lVar1 = *(long *)((long)packet + 8);
      if (lVar1 == 0) {
        _mpp_log_l(2,"mpp_packet","Assertion %s failed at %s:%d\n",(char *)0x0,"src != __null",
                   "mpp_packet_read",0x188);
        if ((mpp_debug._3_1_ & 0x10) != 0) {
          abort();
        }
      }
      memcpy(data,(void *)(lVar1 + offset),size);
      MVar2 = MPP_OK;
    }
  }
  return MVar2;
}

Assistant:

MPP_RET mpp_packet_read(MppPacket packet, size_t offset, void *data, size_t size)
{
    if (check_is_mpp_packet(packet) || NULL == data) {
        mpp_err_f("invalid input: packet %p data %p\n", packet, data);
        return MPP_ERR_UNKNOW;
    }

    if (0 == size)
        return MPP_OK;

    void *src = mpp_packet_get_data(packet);
    mpp_assert(src != NULL);
    memcpy(data, (char*)src + offset, size);
    return MPP_OK;
}